

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_revision(lyout *out,int level,lys_module *module,lys_revision *rev)

{
  int level_00;
  
  if (((rev->dsc == (char *)0x0) && (rev->ref == (char *)0x0)) && (rev->ext_size == '\0')) {
    ly_print(out,"%*srevision %s;\n",(ulong)(uint)(level * 2),"",rev);
    return;
  }
  ly_print(out,"%*srevision %s {\n",(ulong)(uint)(level * 2));
  level_00 = level + 1;
  yang_print_extension_instances
            (out,level_00,module,LYEXT_SUBSTMT_SELF,'\0',rev->ext,(uint)rev->ext_size);
  yang_print_substmt(out,level_00,LYEXT_SUBSTMT_DESCRIPTION,'\0',rev->dsc,module,rev->ext,
                     (uint)rev->ext_size);
  yang_print_substmt(out,level_00,LYEXT_SUBSTMT_REFERENCE,'\0',rev->ref,module,rev->ext,
                     (uint)rev->ext_size);
  ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
  return;
}

Assistant:

static void
yang_print_revision(struct lyout *out, int level, const struct lys_module *module, const struct lys_revision *rev)
{
    if (rev->dsc || rev->ref || rev->ext_size) {
        ly_print(out, "%*srevision %s {\n", LEVEL, INDENT, rev->date);
        yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_SELF, 0, rev->ext, rev->ext_size);
        yang_print_substmt(out, level + 1, LYEXT_SUBSTMT_DESCRIPTION, 0, rev->dsc, module, rev->ext, rev->ext_size);
        yang_print_substmt(out, level + 1, LYEXT_SUBSTMT_REFERENCE, 0, rev->ref, module, rev->ext, rev->ext_size);
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*srevision %s;\n", LEVEL, INDENT, rev->date);
    }
}